

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void __thiscall Args::HelpPrinter::print(HelpPrinter *this,ArgIface *arg,OutStreamType *to)

{
  ostream *this_00;
  ostream *poVar1;
  ostream *in_RDX;
  ArgIface *in_RSI;
  HelpPrinter *in_RDI;
  size_type in_stack_00000048;
  size_type in_stack_00000050;
  size_type in_stack_00000058;
  StringList *in_stack_00000060;
  OutStreamType *in_stack_00000068;
  HelpPrinter *in_stack_00000070;
  StringList usage;
  anon_class_8_1_3fcf6739 in_stack_ffffffffffffff48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffffd0;
  HelpPrinter *in_stack_ffffffffffffffd8;
  
  (*in_RSI->_vptr_ArgIface[5])();
  createUsageString_abi_cxx11_(in_RDI,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  std::operator<<(in_RDX,"USAGE: ");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff48.to);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_ffffffffffffff48.to);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Args::HelpPrinter::print(Args::ArgIface*,std::ostream&)const::_lambda(std::__cxx11::string_const&)_1_>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this_00 = std::operator<<(in_RDX,"\n");
  std::operator<<(this_00,"\n");
  (*in_RSI->_vptr_ArgIface[0xb])();
  splitToWords(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  printString(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
              in_stack_00000050,in_stack_00000048);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  poVar1 = std::operator<<(in_RDX,"\n");
  std::operator<<(poVar1,"\n");
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  return;
}

Assistant:

inline void
HelpPrinter::print( ArgIface * arg, OutStreamType & to ) const
{
	StringList usage = createUsageString( arg,
		arg->isRequired() );

	to << "USAGE: ";

	std::for_each( usage.cbegin(), usage.cend(),
		[ & ] ( const String & s )
			{ to << s << ' '; }
	);

	to << "\n" << "\n";

	printString( to, splitToWords( arg->longDescription() ),
		0, 7, 7 );

	to << "\n" << "\n";

	to.flush();
}